

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void __thiscall re2::Regexp::~Regexp(Regexp *this)

{
  uint8 uVar1;
  string *this_00;
  CharClassBuilder *this_01;
  ostream *poVar2;
  LogMessage local_190;
  Regexp *local_10;
  Regexp *this_local;
  
  local_10 = this;
  if (this->nsub_ != 0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.cc",0x22
              );
    poVar2 = LogMessage::stream(&local_190);
    std::operator<<(poVar2,"Regexp not destroyed.");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  uVar1 = this->op_;
  if (uVar1 == '\x04') {
    if ((this->field_7).the_union_[1] != (void *)0x0) {
      operator_delete__((this->field_7).the_union_[1]);
    }
  }
  else if (uVar1 == '\v') {
    this_00 = (string *)(this->field_7).field_1.name_;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string(this_00);
      operator_delete(this_00);
    }
  }
  else if (uVar1 == '\x14') {
    if ((this->field_7).field_3.cc_ != (CharClass *)0x0) {
      CharClass::Delete((this->field_7).field_3.cc_);
    }
    this_01 = (this->field_7).field_3.ccb_;
    if (this_01 != (CharClassBuilder *)0x0) {
      CharClassBuilder::~CharClassBuilder(this_01);
      operator_delete(this_01);
    }
  }
  return;
}

Assistant:

Regexp::~Regexp() {
  if (nsub_ > 0)
    LOG(DFATAL) << "Regexp not destroyed.";

  switch (op_) {
    default:
      break;
    case kRegexpCapture:
      delete name_;
      break;
    case kRegexpLiteralString:
      delete[] runes_;
      break;
    case kRegexpCharClass:
      if (cc_)
        cc_->Delete();
      delete ccb_;
      break;
  }
}